

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void getSubVectorsTranspose
               (HighsIndexCollection *index_collection,HighsInt data_dim,double *data0,double *data1
               ,double *data2,HighsSparseMatrix *matrix,HighsInt *num_sub_vector,
               double *sub_vector_data0,double *sub_vector_data1,double *sub_vector_data2,
               HighsInt *sub_matrix_num_nz,HighsInt *sub_matrix_start,HighsInt *sub_matrix_index,
               double *sub_matrix_value)

{
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  HighsInt current_set_entry;
  HighsInt local_a4;
  HighsInt local_a0;
  int local_9c;
  HighsInt local_98;
  int local_94;
  int local_90;
  int local_8c;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  double *local_50;
  double *local_48;
  double *local_40;
  value_type_conflict2 local_34;
  
  local_50 = data0;
  local_48 = data1;
  local_40 = data2;
  limits(index_collection,&local_94,&local_8c);
  local_a0 = -1;
  local_a4 = 0;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&local_88,(long)data_dim);
  *num_sub_vector = 0;
  *sub_matrix_num_nz = 0;
  if (index_collection->is_mask_ == true) {
    piVar3 = (index_collection->mask_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < data_dim) {
      uVar8 = (ulong)(uint)data_dim;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      if (piVar3[uVar7] == 0) {
        local_88._M_impl.super__Vector_impl_data._M_start[uVar7] = -1;
      }
      else {
        iVar12 = *num_sub_vector;
        local_88._M_impl.super__Vector_impl_data._M_start[uVar7] = iVar12;
        *num_sub_vector = iVar12 + 1;
      }
    }
  }
  else {
    local_98 = -1;
    local_a4 = 0;
    iVar12 = local_94;
    do {
      if (local_8c < iVar12) break;
      updateOutInIndex(index_collection,&local_9c,&local_a0,&local_90,&local_98,&local_a4);
      if (iVar12 == local_94) {
        for (lVar11 = 0; lVar11 < local_9c; lVar11 = lVar11 + 1) {
          local_88._M_impl.super__Vector_impl_data._M_start[lVar11] = -1;
        }
      }
      for (lVar11 = (long)local_9c; lVar11 <= local_a0; lVar11 = lVar11 + 1) {
        iVar2 = *num_sub_vector;
        local_88._M_impl.super__Vector_impl_data._M_start[lVar11] = iVar2;
        *num_sub_vector = iVar2 + 1;
      }
      for (lVar11 = (long)local_90; lVar11 <= local_98; lVar11 = lVar11 + 1) {
        local_88._M_impl.super__Vector_impl_data._M_start[lVar11] = -1;
      }
      iVar12 = iVar12 + 1;
    } while (local_98 < data_dim + -1);
  }
  iVar12 = *num_sub_vector;
  if ((long)iVar12 != 0) {
    uVar8 = 0;
    uVar7 = (ulong)(uint)data_dim;
    if (data_dim < 1) {
      uVar7 = uVar8;
    }
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      lVar11 = (long)local_88._M_impl.super__Vector_impl_data._M_start[uVar8];
      if (-1 < lVar11) {
        if (sub_vector_data0 != (double *)0x0) {
          sub_vector_data0[lVar11] = local_50[uVar8];
        }
        if (sub_vector_data1 != (double *)0x0) {
          sub_vector_data1[lVar11] = local_48[uVar8];
        }
        if (sub_vector_data2 != (double *)0x0) {
          sub_vector_data2[lVar11] = local_40[uVar8];
        }
      }
    }
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              ((vector<int,_std::allocator<int>_> *)&local_68,(long)iVar12,&local_34);
    piVar3 = (matrix->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = (int)((ulong)((long)(matrix->start_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
    uVar8 = 0;
    uVar7 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar7 = uVar8;
    }
    while (uVar8 != uVar7) {
      piVar1 = piVar3 + uVar8;
      uVar8 = uVar8 + 1;
      piVar4 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar11 = (long)*piVar1; lVar11 < piVar3[uVar8]; lVar11 = lVar11 + 1) {
        if (-1 < (long)local_88._M_impl.super__Vector_impl_data._M_start[piVar4[lVar11]]) {
          local_68._M_impl.super__Vector_impl_data._M_start
          [local_88._M_impl.super__Vector_impl_data._M_start[piVar4[lVar11]]] =
               local_68._M_impl.super__Vector_impl_data._M_start
               [local_88._M_impl.super__Vector_impl_data._M_start[piVar4[lVar11]]] + 1;
        }
      }
    }
    if (sub_matrix_start == (HighsInt *)0x0) {
      for (lVar11 = 0; lVar11 < *num_sub_vector; lVar11 = lVar11 + 1) {
        *sub_matrix_num_nz =
             *sub_matrix_num_nz + local_68._M_impl.super__Vector_impl_data._M_start[lVar11];
      }
    }
    else {
      *sub_matrix_start = 0;
      for (lVar11 = 0; lVar10 = (long)*num_sub_vector, lVar11 < lVar10 + -1; lVar11 = lVar11 + 1) {
        sub_matrix_start[lVar11 + 1] =
             local_68._M_impl.super__Vector_impl_data._M_start[lVar11] + sub_matrix_start[lVar11];
        local_68._M_impl.super__Vector_impl_data._M_start[lVar11] = sub_matrix_start[lVar11];
      }
      *sub_matrix_num_nz =
           local_68._M_impl.super__Vector_impl_data._M_start[lVar10 + -1] +
           sub_matrix_start[lVar10 + -1];
      if (sub_matrix_index != (HighsInt *)0x0 || sub_matrix_value != (double *)0x0) {
        local_68._M_impl.super__Vector_impl_data._M_start[lVar10 + -1] =
             sub_matrix_start[lVar10 + -1];
        uVar8 = 0;
        while (uVar9 = uVar8, uVar9 != uVar7) {
          piVar4 = (matrix->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar5 = (matrix->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar11 = (long)piVar3[uVar9]; uVar8 = uVar9 + 1, lVar11 < piVar3[uVar9 + 1];
              lVar11 = lVar11 + 1) {
            lVar10 = (long)local_88._M_impl.super__Vector_impl_data._M_start[piVar4[lVar11]];
            if (-1 < lVar10) {
              iVar12 = local_68._M_impl.super__Vector_impl_data._M_start[lVar10];
              if (sub_matrix_index != (HighsInt *)0x0) {
                sub_matrix_index[iVar12] = (HighsInt)uVar9;
              }
              if (sub_matrix_value != (double *)0x0) {
                sub_matrix_value[iVar12] = pdVar5[lVar11];
              }
              local_68._M_impl.super__Vector_impl_data._M_start[lVar10] =
                   local_68._M_impl.super__Vector_impl_data._M_start[lVar10] + 1;
            }
          }
        }
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void getSubVectorsTranspose(const HighsIndexCollection& index_collection,
                            const HighsInt data_dim, const double* data0,
                            const double* data1, const double* data2,
                            const HighsSparseMatrix& matrix,
                            HighsInt& num_sub_vector, double* sub_vector_data0,
                            double* sub_vector_data1, double* sub_vector_data2,
                            HighsInt& sub_matrix_num_nz,
                            HighsInt* sub_matrix_start,
                            HighsInt* sub_matrix_index,
                            double* sub_matrix_value) {
  // Ensure that if there's no data0 then it's not required in the
  // sub-vector
  if (data0 == nullptr) assert(sub_vector_data0 == nullptr);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < data_dim);
  assert(from_k <= to_k);
  // "Out" means not in the set to be extracted
  // "In" means in the set to be extracted
  HighsInt out_from_vector;
  HighsInt out_to_vector;
  HighsInt in_from_vector;
  HighsInt in_to_vector = -1;
  HighsInt current_set_entry = 0;
  // Set up a mask so that entries to be got from the matrix can be
  // identified and have their correct index.
  vector<HighsInt> new_index;
  new_index.resize(data_dim);

  num_sub_vector = 0;
  sub_matrix_num_nz = 0;
  if (!index_collection.is_mask_) {
    out_to_vector = -1;
    current_set_entry = 0;
    for (HighsInt k = from_k; k <= to_k; k++) {
      updateOutInIndex(index_collection, in_from_vector, in_to_vector,
                       out_from_vector, out_to_vector, current_set_entry);
      if (k == from_k) {
        // Account for any initial vectors not being extracted
        for (HighsInt iVector = 0; iVector < in_from_vector; iVector++) {
          new_index[iVector] = -1;
        }
      }
      for (HighsInt iVector = in_from_vector; iVector <= in_to_vector;
           iVector++) {
        new_index[iVector] = num_sub_vector;
        num_sub_vector++;
      }
      for (HighsInt iVector = out_from_vector; iVector <= out_to_vector;
           iVector++) {
        new_index[iVector] = -1;
      }
      if (out_to_vector >= data_dim - 1) break;
    }
  } else {
    for (HighsInt iVector = 0; iVector < data_dim; iVector++) {
      if (index_collection.mask_[iVector]) {
        new_index[iVector] = num_sub_vector;
        num_sub_vector++;
      } else {
        new_index[iVector] = -1;
      }
    }
  }

  // Bail out if no vectors are to be extracted
  if (num_sub_vector == 0) return;

  for (HighsInt iVector = 0; iVector < data_dim; iVector++) {
    HighsInt new_iVector = new_index[iVector];
    if (new_iVector >= 0) {
      assert(new_iVector < num_sub_vector);
      if (sub_vector_data0 != NULL)
        sub_vector_data0[new_iVector] = data0[iVector];
      if (sub_vector_data1 != NULL)
        sub_vector_data1[new_iVector] = data1[iVector];
      if (sub_vector_data2 != NULL)
        sub_vector_data2[new_iVector] = data2[iVector];
    }
  }
  const bool extract_start = sub_matrix_start != NULL;
  const bool extract_index = sub_matrix_index != NULL;
  const bool extract_value = sub_matrix_value != NULL;
  const bool extract_matrix = extract_index || extract_value;
  // Allocate an array of lengths for the sub-matrix to be
  // extracted: necessary even if just the number of nonzeros is
  // required
  vector<HighsInt> sub_matrix_length;
  sub_matrix_length.assign(num_sub_vector, 0);
  // Identify the lengths of the vectors in the sub-matrix to be extracted
  HighsInt num_vector = matrix.start_.size() - 1;
  for (HighsInt vector = 0; vector < num_vector; vector++) {
    for (HighsInt iEl = matrix.start_[vector]; iEl < matrix.start_[vector + 1];
         iEl++) {
      HighsInt iVector = matrix.index_[iEl];
      HighsInt new_iVector = new_index[iVector];
      if (new_iVector >= 0) sub_matrix_length[new_iVector]++;
    }
  }
  if (!extract_start) {
    // bail out if no matrix starts are to be extracted, but only after
    // computing the number of nonzeros
    for (HighsInt iVector = 0; iVector < num_sub_vector; iVector++)
      sub_matrix_num_nz += sub_matrix_length[iVector];
    return;
  }
  // Allocate an array of lengths for the sub-matrix to be extracted
  sub_matrix_start[0] = 0;
  for (HighsInt iVector = 0; iVector < num_sub_vector - 1; iVector++) {
    sub_matrix_start[iVector + 1] =
        sub_matrix_start[iVector] + sub_matrix_length[iVector];
    sub_matrix_length[iVector] = sub_matrix_start[iVector];
  }
  HighsInt iVector = num_sub_vector - 1;
  sub_matrix_num_nz = sub_matrix_start[iVector] + sub_matrix_length[iVector];
  // Bail out if matrix indices and values are not required
  if (!extract_matrix) return;
  sub_matrix_length[iVector] = sub_matrix_start[iVector];
  // Fill the row-wise matrix with indices and values
  for (HighsInt vector = 0; vector < num_vector; vector++) {
    for (HighsInt iEl = matrix.start_[vector]; iEl < matrix.start_[vector + 1];
         iEl++) {
      HighsInt iVector = matrix.index_[iEl];
      HighsInt new_iVector = new_index[iVector];
      if (new_iVector >= 0) {
        HighsInt row_iEl = sub_matrix_length[new_iVector];
        if (extract_index) sub_matrix_index[row_iEl] = vector;
        if (extract_value) sub_matrix_value[row_iEl] = matrix.value_[iEl];
        sub_matrix_length[new_iVector]++;
      }
    }
  }
}